

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

long boyi_search(char n_w,char n_b,char (*board) [8],char s,char f,long a,long b)

{
  uint uVar1;
  bool bVar2;
  byte s_00;
  char cVar3;
  int iVar4;
  int iVar5;
  STATE SVar6;
  long lVar7;
  byte s_01;
  ulong uVar8;
  char n_w_00;
  int iVar9;
  ulong unaff_RBX;
  long lVar10;
  ulong unaff_RBP;
  char cVar11;
  char (*pacVar12) [8];
  long lVar13;
  STATE s_02;
  long lVar14;
  ulong local_c8;
  ulong local_c0;
  char local_a8;
  char (*local_a0) [8];
  char (*local_98) [8];
  char (*local_90) [8];
  int (*local_88) [8];
  char new_board [8] [8];
  
  if ((char)(n_b + n_w) == '@') {
    if (AI_COLOR != 4) {
      if (AI_COLOR == 5) goto LAB_001015cc;
      goto LAB_001015f0;
    }
LAB_001019b4:
    uVar8 = 1000000;
    if (n_w <= n_b) {
      uVar8 = 0;
    }
    unaff_RBP = 0xfffffffffff0bdc0;
    if (n_b <= n_w) {
      unaff_RBP = uVar8;
    }
  }
  else {
LAB_001015f0:
    if ((MODE_DEPTH[MODE] + chess_num[1] + chess_num[0] <= (int)(char)(n_b + n_w)) &&
       (chess_num[1] + chess_num[0] <= 0x40 - MODE_DEPTH_END[MODE])) {
      return 0;
    }
    if (f == '\x01') {
      cVar11 = *(char *)((long)AI_COLOR * 4 + 0x1041b4);
    }
    else {
      uVar1 = (int)s - BOTH;
      unaff_RBP = (ulong)uVar1;
      cVar11 = '\0';
      pacVar12 = board;
      for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
        for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
          if (((*pacVar12)[lVar14] & 0xfeU) != 4) {
            iVar4 = canrev((int)lVar10,(int)lVar14,board,(int)s,0);
            if (iVar4 < 1) {
              (*pacVar12)[lVar14] = '\0';
            }
            else {
              (*pacVar12)[lVar14] = (char)uVar1;
              cVar11 = cVar11 + '\x01';
            }
          }
        }
        pacVar12 = pacVar12 + 1;
      }
      unaff_RBX = 8;
    }
    s_02 = (STATE)s;
    local_c0 = b;
    s_00 = s == '\x04' | 4;
    new_board[0] = *board;
    new_board[1] = board[1];
    new_board[2] = board[2];
    new_board[3] = board[3];
    new_board[4] = board[4];
    new_board[5] = board[5];
    new_board[6] = board[6];
    new_board[7] = board[7];
    if (cVar11 == '\0') {
      if (f != '\x02') {
        lVar10 = boyi_search(n_w,n_b,new_board,s_00,'\x02',a,b);
        return lVar10;
      }
      if (AI_COLOR == 4) goto LAB_001019b4;
      if (AI_COLOR == 5) {
LAB_001015cc:
        lVar10 = 1000000;
        if (n_b <= n_w) {
          lVar10 = 0;
        }
        if (n_b < n_w) {
          return -1000000;
        }
        return lVar10;
      }
    }
    local_a8 = n_b + '\x01';
    local_88 = arg;
    local_a0 = new_board;
    local_90 = chessboard;
    cVar11 = '\0';
    local_c8 = a;
    local_98 = board;
    for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
      for (lVar14 = 0; iVar4 = AI_COLOR, lVar14 != 8; lVar14 = lVar14 + 1) {
        if (f == '\x01') {
          if (AI_COLOR + -3 == (int)(*local_90)[lVar14] || (*local_90)[lVar14] == 3)
          goto LAB_001017c8;
        }
        else if (s_02 - BOTH == (int)(*local_98)[lVar14]) {
LAB_001017c8:
          iVar5 = canrev((int)lVar10,(int)lVar14,new_board,s_02,1);
          (*local_a0)[lVar14] = s;
          if (cVar11 != '\0') {
            if (iVar4 == s_02) {
              if ((long)local_c8 <= (long)unaff_RBX) {
                local_c8 = unaff_RBX;
              }
            }
            else if ((long)unaff_RBX <= (long)local_c0) {
              local_c0 = unaff_RBX;
            }
          }
          iVar9 = -(*local_88)[lVar14];
          if (iVar4 == s_02) {
            iVar9 = (*local_88)[lVar14];
          }
          lVar13 = (long)iVar9;
          cVar3 = (char)iVar5;
          if (s == '\x05') {
            n_w_00 = n_w - cVar3;
            cVar3 = cVar3 + local_a8;
            s_01 = 4;
          }
          else {
            n_w_00 = n_w + '\x01' + cVar3;
            cVar3 = n_b - cVar3;
            s_01 = s_00;
          }
          lVar7 = boyi_search(n_w_00,cVar3,new_board,s_01,'\0',local_c8 - lVar13,local_c0 - lVar13);
          unaff_RBX = lVar7 + lVar13;
          SVar6 = 9 - AI_COLOR;
          if ((SVar6 == s_02) && ((long)unaff_RBX <= (long)local_c8)) {
            return local_c8;
          }
          if ((AI_COLOR == s_02) && ((long)local_c0 <= (long)unaff_RBX)) {
            return local_c0;
          }
          if ((cVar11 == '\0') || ((AI_COLOR == s_02 && ((long)unaff_RBP < (long)unaff_RBX)))) {
            unaff_RBP = unaff_RBX;
            if (f == '\x01') goto LAB_00101922;
          }
          else {
            bVar2 = (long)unaff_RBX < (long)unaff_RBP;
            if (bVar2 && SVar6 == s_02) {
              unaff_RBP = unaff_RBX;
            }
            if ((f == '\x01') && (bVar2 && SVar6 == s_02)) {
LAB_00101922:
              unaff_RBP = unaff_RBX;
              boyi_max_x = (int)lVar10;
              boyi_max_y = (int)lVar14;
            }
          }
          cVar11 = cVar11 + '\x01';
          new_board[0] = *board;
          new_board[1] = board[1];
          new_board[2] = board[2];
          new_board[3] = board[3];
          new_board[4] = board[4];
          new_board[5] = board[5];
          new_board[6] = board[6];
          new_board[7] = board[7];
        }
      }
      local_88 = local_88 + 1;
      local_a0 = local_a0 + 1;
      local_90 = local_90 + 1;
      local_98 = local_98 + 1;
    }
  }
  return unaff_RBP;
}

Assistant:

long boyi_search(char n_w, char n_b, char board[][SIZE], char s, char f, long a, long b) {
    char n = n_w + n_b;
    char i, j;
    if (n == SIZE * SIZE) {
        if (AI_COLOR == BLACK) {
            return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
        }
        if (AI_COLOR == WHITE) {
            return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
        }
/*#ifdef AI_COLOR_BLACK
		return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
#endif
#ifdef AI_COLOR_WHITE
		return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
#endif*/
    }
/*#if (AI_MODE==MODE_EASY)
	if (n >= chess_num[0] + chess_num[1] + 2 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 3)
#elif (AI_MODE==MODE_NORM)
	if (n >= chess_num[0] + chess_num[1] + 5 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 6)
#elif (AI_MODE==MODE_HARD)
	if (n >= chess_num[0] + chess_num[1] + 8 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 12)
#elif (AI_MODE==MODE_HELL)
	if (n >= chess_num[0] + chess_num[1] + 10 && chess_num[0] + chess_num[1] <= SIZE*SIZE - 12)
#endif*/
    if (n >= chess_num[0] + chess_num[1] + MODE_DEPTH[MODE] &&
        chess_num[0] + chess_num[1] <= SIZE * SIZE - MODE_DEPTH_END[MODE]) {
        return 0;
    }
    char num = 0;
    if (f != 1) {
        for (i = 0; i < SIZE; i++) {
            for (j = 0; j < SIZE; j++) {
                if (board[i][j] != WHITE && board[i][j] != BLACK) {
                    if (canrev(i, j, board, s, 0) > 0) {
                        board[i][j] = s - 3;
                        num++;
                    } else {
                        board[i][j] = EMPTY;
                    }
                }
            }
        }
    } else {
        num = num_now[COLOR_bin(AI_COLOR)];
/*#ifdef AI_COLOR_BLACK
		num = num_now[1];
#endif
#ifdef AI_COLOR_WHITE
		num = num_now[0];
#endif*/
    }
    long arg_m;
    char rs = (s == WHITE ? BLACK : WHITE);
    char new_board[SIZE][SIZE];
    memcpy(new_board, board, SIZE * SIZE);
    if (num == 0) {
        if (f == 2) {
            if (AI_COLOR == BLACK) {
                return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
            }
            if (AI_COLOR == WHITE) {
                return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
            }
/*#ifdef AI_COLOR_BLACK
			return (n_w > n_b ? -1000000 : (n_w < n_b ? 1000000 : 0));
#endif
#ifdef AI_COLOR_WHITE
			return (n_w < n_b ? -1000000 : (n_w > n_b ? 1000000 : 0));
#endif*/
        } else {
            return boyi_search(n_w, n_b, new_board, rs, 2, a, b);
        }
    }
    num = 0;
    for (i = 0; i < SIZE; i++) {
        for (j = 0; j < SIZE; j++) {
            if (f == 1) {
                if (chessboard[i][j] != COLOR_(AI_COLOR) && chessboard[i][j] != BOTH)
/*#ifdef AI_COLOR_BLACK
				if (chessboard[i][j] != BLACK_&&chessboard[i][j] != BOTH)
#endif
#ifdef AI_COLOR_WHITE
				if (chessboard[i][j] != WHITE_&&chessboard[i][j] != BOTH)
#endif*/
                {
                    continue;
                }
            } else {
                if (board[i][j] != s - 3) {
                    continue;
                }
            }
            char rev = canrev(i, j, new_board, s, 1);
            new_board[i][j] = s;
            long arg_now;
            if (num != 0) {
                if (s == AI_COLOR)
/*#ifdef AI_COLOR_BLACK
				if (s == BLACK)
#endif
#ifdef AI_COLOR_WHITE
				if (s == WHITE)
#endif*/
                {
                    a = max(a, arg_now);
                } else {
                    b = min(b, arg_now);
                }
            }
            long arg_d = getarg(i, j, s);
            if (s == BLACK) {
                arg_now = boyi_search(n_w - rev, n_b + rev + 1, new_board, rs, 0, a - arg_d, b - arg_d) + arg_d;
            } else {
                arg_now = boyi_search(n_w + rev + 1, n_b - rev, new_board, rs, 0, a - arg_d, b - arg_d) + arg_d;
            }
            if (s == COLOR_rev(AI_COLOR) && arg_now <= a)//alpha
/*#ifdef AI_COLOR_BLACK
			if (s == WHITE&&arg_now <= a)//alpha
#endif
#ifdef AI_COLOR_WHITE
			if (s == BLACK&&arg_now <= a)//alpha
#endif*/
            {
                return a;
            }
            if (s == AI_COLOR && arg_now >= b)//beita
/*#ifdef AI_COLOR_BLACK
			if (s == BLACK&&arg_now >= b)//beita
#endif
#ifdef AI_COLOR_WHITE
			if (s == WHITE&&arg_now >= b)//beita
#endif*/
            {
                return b;
            }
            if (num == 0 || s == AI_COLOR && arg_now > arg_m || s == COLOR_rev(AI_COLOR) && arg_now < arg_m)
/*#ifdef AI_COLOR_BLACK
			if (num == 0 || s == BLACK &&arg_now > arg_m || s == WHITE&&arg_now < arg_m)
#endif
#ifdef AI_COLOR_WHITE
			if (num == 0 || s == BLACK &&arg_now < arg_m || s == WHITE&&arg_now > arg_m)
#endif*/
            {
                arg_m = arg_now;
                if (f == 1) {
                    boyi_max_x = i;
                    boyi_max_y = j;
                }
            }
            num++;
            memcpy(new_board, board, SIZE * SIZE);
        }
    }
    return arg_m;
}